

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::reset(IMLE *this)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer __p;
  
  pFVar1 = (this->experts).
           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->experts).
           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar2 != pFVar1) {
    __p = pFVar1;
    do {
      __gnu_cxx::new_allocator<FastLinearExpert>::destroy
                ((new_allocator<FastLinearExpert> *)&this->experts,__p);
      __p = __p + 1;
    } while (__p != pFVar2);
    (this->experts).
    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  set_internal_parameters(this);
  this->noise_to_go = 0;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::reset()
{
    experts.clear();
    set_internal_parameters();

    noise_to_go = 0;
}